

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrowRef
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ThrowRef *curr)

{
  bool bVar1;
  Literal *pLVar2;
  Literal local_40;
  
  visit(__return_storage_ptr__,this,curr->exnref);
  if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
    return __return_storage_ptr__;
  }
  pLVar2 = Flow::getSingleValue(__return_storage_ptr__);
  bVar1 = Type::isNull(&pLVar2->type);
  if (bVar1) {
    (*this->_vptr_ExpressionRunner[2])(this,"null ref");
  }
  bVar1 = Type::isExn(&pLVar2->type);
  if (bVar1) {
    ::wasm::Literal::Literal(&local_40,pLVar2);
    (*this->_vptr_ExpressionRunner[4])(this,&local_40);
    ::wasm::Literal::~Literal(&local_40);
    ::wasm::handle_unreachable
              ("throw",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0x633);
  }
  __assert_fail("exnref.isExn()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                ,0x631,
                "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitThrowRef(ThrowRef *) [SubType = wasm::ModuleRunner]"
               );
}

Assistant:

Flow visitThrowRef(ThrowRef* curr) {
    NOTE_ENTER("ThrowRef");
    Flow flow = visit(curr->exnref);
    if (flow.breaking()) {
      return flow;
    }
    const auto& exnref = flow.getSingleValue();
    NOTE_EVAL1(exnref);
    if (exnref.isNull()) {
      trap("null ref");
    }
    assert(exnref.isExn());
    throwException(WasmException{exnref});
    WASM_UNREACHABLE("throw");
  }